

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_append_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 5;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x114468;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(array.buffer,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '\0';
  uStack_60 = 0x1144a3;
  bVar1 = private_ACUtils_ADynArray_insertArray(&array,0xffffffffffffffff,&c,1,1);
  if (bVar1 == true) {
    uStack_60 = 0x1144bd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x4fc);
    if (array.size == 6) {
      uStack_60 = 0x1144dd;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x4fd);
      if (array.capacity == 8) {
        uStack_60 = 0x1144fd;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x4fe);
        if (array.buffer == (char *)0x0) {
          ppcVar5 = &local_68;
          pcVar7 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar9 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x4ff;
LAB_00114790:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(undefined8 *)((long)ppcVar5 + -8) = 0x114797;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar7,pcVar4,pcVar9,pcVar8);
        }
        uStack_60 = 0x11451a;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x4ff);
        if ((char *)(long)array.buffer[array.size - 1] != (char *)0x0) {
          ppcVar5 = &local_78;
          local_70 = "\'\\0\'";
          pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar9 = "array.buffer[array.size - 1] == \'\\0\'";
          pcVar8 = "array.buffer[array.size - 1]";
          iVar2 = 0x500;
          local_78 = (char *)(long)array.buffer[array.size - 1];
          goto LAB_00114790;
        }
        uStack_60 = 0x114544;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x500);
        pcVar8 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar4 = "";
          pcVar8 = "(null)";
        }
        else {
          uStack_60 = 0x114561;
          iVar2 = strcmp("01234",array.buffer);
          if (iVar2 == 0) {
            uStack_60 = 0x11457a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x501);
            if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar5 = &local_68;
              pcVar7 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar9 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x502;
              goto LAB_00114790;
            }
            uStack_60 = 0x114597;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x502);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_60 = 0x1145b9;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x503);
              uStack_60 = 0x1145c2;
              (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
              return;
            }
            local_70 = "1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x503;
            pcVar4 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_001147c6;
          }
          pcVar4 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "array.buffer == \"01234\"";
        pcVar9 = "array.buffer";
        iVar2 = 0x501;
        local_68 = "\"";
        local_70 = "01234";
        local_78 = "\"";
        pcStack_80 = "\"01234\"";
        ppcVar6 = &pcStack_90;
        pcStack_90 = pcVar8;
        pcStack_88 = pcVar4;
        goto LAB_001147ce;
      }
      local_70 = "8";
      pcVar7 = "array.capacity == 8";
      pcVar9 = "array.capacity";
      iVar2 = 0x4fe;
      local_68 = (char *)0x8;
      pcVar4 = (char *)array.capacity;
    }
    else {
      local_70 = "6";
      pcVar7 = "array.size == 6";
      pcVar9 = "array.size";
      iVar2 = 0x4fd;
      local_68 = (char *)0x6;
      pcVar4 = (char *)array.size;
    }
  }
  else {
    pcVar4 = (char *)(ulong)bVar1;
    local_70 = "true";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == true";
    pcVar9 = "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
    ;
    iVar2 = 0x4fc;
LAB_001147c6:
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_70;
LAB_001147ce:
  uStack_60 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(code **)((long)ppcVar6 + -0x10) = test_ADynArray_append_failure_bufferExpansionFailed_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar7,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[array.size - 1], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}